

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darCore.c
# Opt level: O0

int Dar_ManCutCount(Aig_Man_t *pAig,int *pnCutsK)

{
  int iVar1;
  Aig_Obj_t *pObj_00;
  int local_38;
  int local_34;
  int nCutsK;
  int nCuts;
  int k;
  int i;
  Aig_Obj_t *pObj;
  Dar_Cut_t *pCut;
  int *pnCutsK_local;
  Aig_Man_t *pAig_local;
  
  local_34 = 0;
  local_38 = 0;
  for (nCuts = 0; iVar1 = Vec_PtrSize(pAig->vObjs), nCuts < iVar1; nCuts = nCuts + 1) {
    pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,nCuts);
    if ((pObj_00 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pObj_00), iVar1 != 0)) {
      pObj = (Aig_Obj_t *)Dar_ObjCuts(pObj_00);
      for (nCutsK = 0;
          nCutsK < (int)(uint)(byte)((ulong)*(undefined8 *)&pObj_00->field_0x18 >> 0x38);
          nCutsK = nCutsK + 1) {
        if (((*(uint *)((long)&pObj->field_0 + 4) >> 0x1c & 1) != 0) &&
           (local_34 = local_34 + 1, *(uint *)((long)&pObj->field_0 + 4) >> 0x1d == 4)) {
          local_38 = local_38 + 1;
        }
        pObj = (Aig_Obj_t *)&pObj->field_0x18;
      }
    }
  }
  if (pnCutsK != (int *)0x0) {
    *pnCutsK = local_38;
  }
  return local_34;
}

Assistant:

int Dar_ManCutCount( Aig_Man_t * pAig, int * pnCutsK )
{
    Dar_Cut_t * pCut;
    Aig_Obj_t * pObj;
    int i, k, nCuts = 0, nCutsK = 0;
    Aig_ManForEachNode( pAig, pObj, i )
        Dar_ObjForEachCut( pObj, pCut, k )
        {
            nCuts++;
            if ( pCut->nLeaves == 4 )
                nCutsK++;
        }
    if ( pnCutsK )
        *pnCutsK = nCutsK;
    return nCuts;
}